

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O0

void xmrig::cryptonight_single_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  __m128i bx0_00;
  __m128i bx1_00;
  uint32_t uVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  uint64_t uVar8;
  long *in_RCX;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint8_t *in_RDX;
  __m128i *in_RSI;
  __m128i *in_RDI;
  longlong in_R8;
  __m128i *in_R9;
  ulong extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i ax0_00;
  __m128i chunk3;
  __m128i chunk2;
  __m128i chunk1;
  uint64_t division_result;
  uint64_t cx_1;
  uint32_t d;
  uint64_t cx_0;
  uint64_t sqrt_result;
  uint64_t ch;
  uint64_t cl;
  uint64_t lo;
  uint64_t hi;
  __m128i ax0;
  __m128i cx;
  size_t i;
  __m128i bx1;
  __m128i bx0;
  uint64_t idx0;
  uint64_t ah0;
  uint64_t al0;
  __m128i sqrt_result_xmm_0;
  __m128i division_result_xmm_0;
  uint8_t *l0;
  uint64_t *h0;
  uint32_t iters;
  size_t MASK;
  uint32_t y3;
  uint32_t y2;
  uint32_t y1;
  uint32_t y0;
  uint32_t x3;
  uint32_t x2;
  uint32_t x1;
  uint32_t x0;
  size_t in_stack_fffffffffffffbd8;
  uint8_t *in_stack_fffffffffffffbe0;
  long in_stack_fffffffffffffbe8;
  long in_stack_fffffffffffffbf0;
  int local_3d8;
  int local_3d0;
  ulong local_3b0;
  ulong local_3a8;
  ulong uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  ulong local_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  ulong local_338;
  undefined8 uStack_330;
  ulong local_328;
  undefined8 uStack_320;
  uint8_t *local_310;
  ulong *local_308;
  uint local_2fc;
  undefined8 local_2f8;
  __m128i *local_2f0;
  long *local_2e0;
  uint8_t *local_2d8;
  byte local_2b0;
  byte local_2ac;
  byte local_2a8;
  byte local_2a4;
  
  local_2f8 = 0xffff0;
  local_2f0 = in_R9;
  local_2e0 = in_RCX;
  local_2d8 = in_RDX;
  uVar4 = CnAlgo::iterations((CnAlgo *)
                             &cryptonight_single_hash<true>(unsigned_char_const*,unsigned_long,unsigned_char*,cryptonight_ctx**,unsigned_long,unsigned_long)
                              ::props);
  local_2fc = (uint)((long)*local_2f0 + (ulong)uVar4 >> 1);
  keccak(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(uint8_t *)0x25ec26);
  cn_explode_scratchpad<true>(in_RDI,in_RSI);
  local_308 = (ulong *)*local_2e0;
  local_310 = *(uint8_t **)(*local_2e0 + 0xe0);
  local_328 = local_308[0xc];
  uStack_320 = 0;
  local_338 = local_308[0xd];
  uStack_330 = 0;
  fesetround(0x400);
  local_340 = *local_308 ^ local_308[4];
  local_348 = local_308[1] ^ local_308[5];
  uStack_360 = local_308[3] ^ local_308[7];
  local_368 = local_308[2] ^ local_308[6];
  uStack_370 = local_308[9] ^ local_308[0xb];
  local_378 = local_308[8] ^ local_308[10];
  for (local_380 = 0; local_350 = local_340, local_380 < local_2fc; local_380 = local_380 + 1) {
    local_3a8 = local_340;
    uStack_3a0 = local_348;
    puVar6 = (uint *)(local_310 + ((uint)local_340 & 0xffff0));
    uVar5 = *puVar6;
    uVar1 = puVar6[1];
    uVar2 = puVar6[2];
    uVar3 = puVar6[3];
    local_2a4 = (byte)uVar5;
    uVar9 = (ulong)local_2a4;
    local_2a8 = (byte)uVar1;
    uVar10 = (ulong)local_2a8;
    local_2ac = (byte)uVar2;
    uVar11 = (ulong)local_2ac;
    local_2b0 = (byte)uVar3;
    uVar7 = (ulong)local_2b0;
    local_2a8 = (byte)(uVar1 >> 8);
    uVar12 = (ulong)local_2a8;
    local_2ac = (byte)(uVar2 >> 8);
    uVar13 = (ulong)local_2ac;
    local_2b0 = (byte)(uVar3 >> 8);
    uVar14 = (ulong)local_2b0;
    local_2a4 = (byte)(uVar5 >> 8);
    uVar15 = (ulong)local_2a4;
    local_2ac = (byte)(uVar2 >> 0x10);
    local_2b0 = (byte)(uVar3 >> 0x10);
    local_2a4 = (byte)(uVar5 >> 0x10);
    local_2a8 = (byte)(uVar1 >> 0x10);
    local_398 = CONCAT44(saes_table[0][uVar10] ^ saes_table[1][uVar13] ^ saes_table[2][local_2b0] ^
                         saes_table[2][(uVar5 >> 0x18) + 0x100],
                         saes_table[0][uVar9] ^ saes_table[1][uVar12] ^ saes_table[2][local_2ac] ^
                         saes_table[2][(uVar3 >> 0x18) + 0x100]) ^ local_340;
    uStack_390 = CONCAT44(saes_table[0][uVar7] ^ saes_table[1][uVar15] ^ saes_table[2][local_2a8] ^
                          saes_table[2][(uVar2 >> 0x18) + 0x100],
                          saes_table[0][uVar11] ^ saes_table[1][uVar14] ^ saes_table[2][local_2a4] ^
                          saes_table[2][(uVar1 >> 0x18) + 0x100]) ^ local_348;
    uVar9 = (ulong)((uint)local_340 & 0xffff0);
    bx0_00[1] = (longlong)in_stack_fffffffffffffbe0;
    bx0_00[0] = in_stack_fffffffffffffbd8;
    bx1_00[1] = in_stack_fffffffffffffbf0;
    bx1_00[0] = in_stack_fffffffffffffbe8;
    ax0_00[1] = in_R8;
    ax0_00[0] = (longlong)&local_398;
    cryptonight_monero_tweak
              ((uint64_t *)(local_310 + uVar9),local_310,uVar9,ax0_00,bx0_00,bx1_00,in_R9);
    local_350 = local_398;
    uVar9 = *(ulong *)(local_310 + (local_398 & 0xffff0) + 8);
    uVar7 = *(ulong *)(local_310 + (local_398 & 0xffff0)) ^ local_328 ^ local_338 << 0x20;
    local_3d8 = (int)local_398;
    local_3d0 = (int)local_338;
    uVar5 = local_3d8 + local_3d0 * 2 | 0x80000001;
    local_328 = uStack_390 / uVar5 & 0xffffffff | uStack_390 % (ulong)uVar5 << 0x20;
    uStack_320 = 0;
    int_sqrt_v2(local_398 + local_328);
    local_338 = extraout_XMM0_Qa;
    uStack_330 = extraout_XMM0_Qb;
    uVar8 = __umul128(local_350,uVar7,&local_3b0);
    uVar11 = *(ulong *)((long)(local_310 + ((ulong)((uint)local_350 & 0xffff0) ^ 0x10)) + 8);
    uVar12 = *(ulong *)(local_310 + ((ulong)((uint)local_350 & 0xffff0) ^ 0x10)) ^ local_3b0;
    in_stack_fffffffffffffbe8 = *(long *)(local_310 + (local_350 & 0xffff0 ^ 0x20));
    in_stack_fffffffffffffbf0 = *(long *)((long)(local_310 + (local_350 & 0xffff0 ^ 0x20)) + 8);
    local_3b0 = *(ulong *)(local_310 + (local_350 & 0xffff0 ^ 0x20)) ^ local_3b0;
    uVar10 = *(ulong *)(local_310 + (local_350 & 0xffff0 ^ 0x20) + 8);
    in_stack_fffffffffffffbd8 = *(size_t *)(local_310 + (local_350 & 0xffff0 ^ 0x30));
    in_stack_fffffffffffffbe0 = *(uint8_t **)((long)(local_310 + (local_350 & 0xffff0 ^ 0x30)) + 8);
    *(size_t *)(local_310 + (local_350 & 0xffff0 ^ 0x10)) = in_stack_fffffffffffffbd8 + local_378;
    *(uint8_t **)((long)(local_310 + (local_350 & 0xffff0 ^ 0x10)) + 8) =
         in_stack_fffffffffffffbe0 + uStack_370;
    *(ulong *)(local_310 + (local_350 & 0xffff0 ^ 0x20)) = uVar12 + local_368;
    *(ulong *)((long)(local_310 + (local_350 & 0xffff0 ^ 0x20)) + 8) = (uVar11 ^ uVar8) + uStack_360
    ;
    *(ulong *)(local_310 + (local_350 & 0xffff0 ^ 0x30)) = in_stack_fffffffffffffbe8 + local_3a8;
    *(ulong *)((long)(local_310 + (local_350 & 0xffff0 ^ 0x30)) + 8) =
         in_stack_fffffffffffffbf0 + uStack_3a0;
    local_348 = (uVar10 ^ uVar8) + local_348;
    *(ulong *)(local_310 + (local_350 & 0xffff0)) = local_3b0 + local_340;
    *(ulong *)(local_310 + (local_350 & 0xffff0) + 8) = local_348;
    local_340 = uVar7 ^ local_3b0 + local_340;
    local_348 = uVar9 ^ local_348;
    local_378 = local_368;
    uStack_370 = uStack_360;
    local_368 = local_398;
    uStack_360 = uStack_390;
  }
  cn_implode_scratchpad<true>(in_RDI,in_RSI);
  keccakf(local_308,0x18);
  (*extra_hashes[(int)(*(byte *)*local_2e0 & 3)])((uint8_t *)*local_2e0,200,local_2d8);
  return;
}

Assistant:

inline void cryptonight_single_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    keccak(input, size, ctx[0]->state);
    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->state), reinterpret_cast<__m128i *>(ctx[0]->memory));

    uint64_t *h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint8_t *l0   = ctx[0]->memory;

    VARIANT2_INIT(0);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t al0  = h0[0] ^ h0[4];
    uint64_t ah0  = h0[1] ^ h0[5];
    uint64_t idx0 = al0;
    __m128i bx0   = _mm_set_epi64x(static_cast<int64_t>(h0[3] ^ h0[7]), static_cast<int64_t>(h0[2] ^ h0[6]));
    __m128i bx1   = _mm_set_epi64x(static_cast<int64_t>(h0[9] ^ h0[11]), static_cast<int64_t>(h0[8] ^ h0[10]));

    for (size_t i = 0; i < iters; i++) {
        __m128i cx;
        if (!SOFT_AES) {
            cx = _mm_load_si128(reinterpret_cast<const __m128i *>(&l0[idx0 & MASK]));
        }

        const __m128i ax0 = _mm_set_epi64x(static_cast<int64_t>(ah0), static_cast<int64_t>(al0));
        if (SOFT_AES) {
            cx = soft_aesenc(&l0[idx0 & MASK], ax0, reinterpret_cast<const uint32_t*>(saes_table));
        }
        else {
            cx = _mm_aesenc_si128(cx, ax0);
        }

        cryptonight_monero_tweak(reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]), l0, idx0 & MASK, ax0, bx0, bx1, cx);

        idx0 = static_cast<uint64_t>(_mm_cvtsi128_si64(cx));

        uint64_t hi, lo, cl, ch;
        cl = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[0];
        ch = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[1];

        VARIANT2_INTEGER_MATH(0, cl, cx);

        lo = __umul128(idx0, cl, &hi);

        VARIANT2_SHUFFLE2(l0, idx0 & MASK, ax0, bx0, bx1, hi, lo, 0);

        al0 += hi;
        ah0 += lo;

        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[0] = al0;
        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[1] = ah0;

        al0 ^= cl;
        ah0 ^= ch;
        idx0 = al0;
        bx1 = bx0;

        bx0 = cx;
    }

    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->memory), reinterpret_cast<__m128i *>(ctx[0]->state));
    keccakf(h0, 24);
    extra_hashes[ctx[0]->state[0] & 3](ctx[0]->state, 200, output);
}